

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::EndGroup(BasicReporter *this,string *groupName,Totals *totals)

{
  ostream *poVar1;
  allocator local_41;
  SpanInfo local_40;
  
  if (((this->m_groupSpan).emitted == true) && (groupName->_M_string_length != 0)) {
    poVar1 = std::operator<<((this->m_config).m_stream,"[End of group: \'");
    poVar1 = std::operator<<(poVar1,(string *)groupName);
    std::operator<<(poVar1,"\'. ");
    std::__cxx11::string::string((string *)&local_40,"All ",&local_41);
    ReportCounts(this,totals,&local_40.name);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<((this->m_config).m_stream,"]\n");
    std::endl<char,std::char_traits<char>>(poVar1);
    local_40.name._M_dataplus._M_p = (pointer)&local_40.name.field_2;
    local_40.name._M_string_length = 0;
    local_40.name.field_2._M_local_buf[0] = '\0';
    local_40.emitted = false;
    SpanInfo::operator=(&this->m_groupSpan,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

virtual void EndGroup( const std::string& groupName, const Totals& totals ) {
            if( m_groupSpan.emitted && !groupName.empty() ) {
                m_config.stream() << "[End of group: '" << groupName << "'. ";
                ReportCounts( totals );
                m_config.stream() << "]\n" << std::endl;
                m_groupSpan = SpanInfo();
            }
        }